

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O3

Entry * __thiscall
cali::CompressedSnapshotRecordView::unpack_next_entry
          (Entry *__return_storage_ptr__,CompressedSnapshotRecordView *this,
          CaliperMetadataAccessInterface *c,size_t *n,size_t *pos)

{
  size_t sVar1;
  uchar *puVar2;
  anon_union_8_7_33918203_for_value aVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  cali_variant_t cVar11;
  Node *pNVar5;
  
  uVar7 = *n;
  if (uVar7 == 0) {
    *pos = 1;
    uVar7 = *n;
  }
  uVar8 = this->m_num_nodes;
  if (uVar7 < uVar8) {
    *n = uVar7 + 1;
    sVar1 = *pos;
    bVar6 = 0;
    lVar9 = 0;
    uVar7 = 0;
    do {
      bVar10 = this->m_buffer[lVar9 + sVar1];
      if (-1 < (char)bVar10) goto LAB_00186c40;
      uVar7 = uVar7 | (ulong)(bVar10 & 0x7f) << (bVar6 & 0x3f);
      lVar9 = lVar9 + 1;
      bVar6 = bVar6 + 7;
    } while (lVar9 != 9);
    bVar10 = this->m_buffer[sVar1 + 9];
    lVar9 = 9;
LAB_00186c40:
    *pos = sVar1 + lVar9 + 1;
    iVar4 = (**c->_vptr_CaliperMetadataAccessInterface)
                      (c,((ulong)bVar10 & 0x7f) << ((char)lVar9 * '\a' & 0x3fU) | uVar7);
    pNVar5 = (Node *)CONCAT44(extraout_var,iVar4);
    __return_storage_ptr__->m_node = pNVar5;
    aVar3 = (pNVar5->m_data).m_v.value;
    (__return_storage_ptr__->m_value).m_v.type_and_size = (pNVar5->m_data).m_v.type_and_size;
    (__return_storage_ptr__->m_value).m_v.value = aVar3;
  }
  else {
    if (uVar7 == uVar8) {
      *pos = this->m_imm_pos + 1;
      uVar7 = *n;
      uVar8 = this->m_num_nodes;
    }
    if (uVar7 < uVar8 + this->m_num_imm) {
      *n = uVar7 + 1;
      puVar2 = this->m_buffer;
      sVar1 = *pos;
      bVar6 = 0;
      lVar9 = 0;
      uVar7 = 0;
      do {
        bVar10 = puVar2[lVar9 + sVar1];
        if (-1 < (char)bVar10) goto LAB_00186cdb;
        uVar7 = uVar7 | (ulong)(bVar10 & 0x7f) << (bVar6 & 0x3f);
        lVar9 = lVar9 + 1;
        bVar6 = bVar6 + 7;
      } while (lVar9 != 9);
      bVar10 = puVar2[sVar1 + 9];
      lVar9 = 9;
LAB_00186cdb:
      *pos = sVar1 + lVar9 + 1;
      cVar11 = cali_variant_unpack(puVar2 + sVar1 + lVar9 + 1,pos,(_Bool *)0x0);
      iVar4 = (*c->_vptr_CaliperMetadataAccessInterface[1])
                        (c,(ulong)(bVar10 & 0x7f) << ((char)lVar9 * '\a' & 0x3fU) | uVar7);
      __return_storage_ptr__->m_node = (Node *)CONCAT44(extraout_var_00,iVar4);
      (__return_storage_ptr__->m_value).m_v = cVar11;
    }
    else {
      __return_storage_ptr__->m_node = (Node *)0x0;
      (__return_storage_ptr__->m_value).m_v.type_and_size = 0;
      (__return_storage_ptr__->m_value).m_v.value.v_uint = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Entry CompressedSnapshotRecordView::unpack_next_entry(const CaliperMetadataAccessInterface* c, size_t& n, size_t& pos)
{
    if (n == 0)
        pos = 1;

    if (n < m_num_nodes) {
        ++n;
        return Entry(c->node(vldec_u64(m_buffer + pos, &pos)));
    }

    if (n == m_num_nodes)
        pos = m_imm_pos + 1;

    if (n < m_num_nodes + m_num_imm) {
        ++n;

        cali_id_t id   = vldec_u64(m_buffer + pos, &pos);
        Variant   data = Variant::unpack(m_buffer + pos, &pos, nullptr);

        return Entry(c->get_attribute(id), data);
    }

    return Entry();
}